

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmakeRegen.cpp
# Opt level: O0

void RegenerateCmakeAddSubdirectory(ostream *o,Component *comp)

{
  type_conflict tVar1;
  bool bVar2;
  pointer this;
  path *this_00;
  string *__x;
  reference pbVar3;
  ostream *poVar4;
  ostream *in_RDI;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> subdir;
  iterator __end1;
  iterator __begin1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  directory_iterator end;
  directory_iterator it;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  subdirs;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffea8;
  iterator_facade_base<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
  *in_stack_fffffffffffffeb0;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffec0;
  path *in_stack_fffffffffffffec8;
  pointer in_stack_fffffffffffffed0;
  undefined7 in_stack_fffffffffffffed8;
  byte in_stack_fffffffffffffedf;
  string local_108 [32];
  _Self local_e8;
  _Self local_e0;
  undefined1 *local_d8;
  _Base_ptr local_d0;
  undefined1 local_c8;
  path local_c0 [4];
  undefined1 local_40 [56];
  ostream *local_8;
  
  local_8 = in_RDI;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x193504);
  boost::filesystem::directory_iterator::directory_iterator
            ((directory_iterator *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
             (directory_options)((ulong)in_stack_fffffffffffffec0._M_node >> 0x20));
  boost::filesystem::directory_iterator::directory_iterator((directory_iterator *)0x19352a);
  while (tVar1 = boost::iterators::operator!=
                           ((iterator_facade<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long>
                             *)in_stack_fffffffffffffec0._M_node,
                            (iterator_facade<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long>
                             *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8)), tVar1
        ) {
    this = boost::iterators::detail::
           iterator_facade_base<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
           ::operator->((iterator_facade_base<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
                         *)0x19355f);
    this_00 = boost::filesystem::directory_entry::path(this);
    boost::filesystem::path::path
              (this_00,(value_type *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
    boost::filesystem::operator/
              ((path *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8),
               (path *)in_stack_fffffffffffffed0);
    in_stack_fffffffffffffedf =
         boost::filesystem::is_regular_file((path *)in_stack_fffffffffffffeb0);
    boost::filesystem::path::~path((path *)0x1935c7);
    boost::filesystem::path::~path((path *)0x1935d4);
    if ((in_stack_fffffffffffffedf & 1) != 0) {
      in_stack_fffffffffffffed0 =
           boost::iterators::detail::
           iterator_facade_base<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
           ::operator->((iterator_facade_base<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
                         *)0x1935ee);
      boost::filesystem::directory_entry::path(in_stack_fffffffffffffed0);
      boost::filesystem::path::filename();
      __x = boost::filesystem::path::generic_string_abi_cxx11_(local_c0);
      pVar5 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffffed0,__x);
      in_stack_fffffffffffffec0 = pVar5.first._M_node;
      in_stack_fffffffffffffebf = pVar5.second;
      local_d0 = in_stack_fffffffffffffec0._M_node;
      local_c8 = in_stack_fffffffffffffebf;
      boost::filesystem::path::~path((path *)0x193667);
    }
    boost::iterators::detail::
    iterator_facade_base<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
    ::operator++(in_stack_fffffffffffffeb0);
  }
  local_d8 = local_40;
  local_e0._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(in_stack_fffffffffffffea8);
  local_e8._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(in_stack_fffffffffffffea8);
  while (bVar2 = std::operator!=(&local_e0,&local_e8), bVar2) {
    pbVar3 = std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffffeb0);
    std::__cxx11::string::string(local_108,(string *)pbVar3);
    in_stack_fffffffffffffeb0 =
         (iterator_facade_base<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
          *)std::operator<<(local_8,"add_subdirectory(");
    poVar4 = std::operator<<((ostream *)in_stack_fffffffffffffeb0,local_108);
    std::operator<<(poVar4,")\n");
    std::__cxx11::string::~string(local_108);
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffeb0);
  }
  boost::filesystem::directory_iterator::~directory_iterator((directory_iterator *)0x193810);
  boost::filesystem::directory_iterator::~directory_iterator((directory_iterator *)0x19381d);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x19382a);
  return;
}

Assistant:

void RegenerateCmakeAddSubdirectory(std::ostream& o,
                                    const Component& comp)
{
    // Temporary uses a set to sort subdirectories
    std::set<std::string> subdirs;
    filesystem::directory_iterator it(comp.root), end;
    for (; it != end; ++it) {
        if (filesystem::is_regular_file(it->path() / "CMakeLists.txt")) {
            subdirs.insert(it->path().filename().generic_string());
        }
    }
    for (auto subdir : subdirs) {
        o << "add_subdirectory(" << subdir << ")\n";
    }
        
}